

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O3

void aom_quantize_b_64x64_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  bool bVar18;
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  bool bVar27;
  undefined1 auVar28 [14];
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  unkbyte10 Var45;
  undefined1 auVar46 [12];
  undefined1 auVar47 [14];
  undefined1 auVar48 [12];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [12];
  undefined1 auVar53 [14];
  undefined1 auVar54 [12];
  unkbyte10 Var55;
  bool bVar56;
  bool bVar57;
  ulong uVar58;
  uint uVar59;
  short *psVar60;
  long lVar61;
  long lVar62;
  int *piVar63;
  int *piVar64;
  undefined1 auVar65 [16];
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  uint uVar71;
  short sVar90;
  int iVar91;
  short sVar93;
  undefined1 auVar73 [12];
  undefined4 uVar94;
  short sVar97;
  undefined4 uVar98;
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  int iVar72;
  int iVar95;
  int iVar99;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  short sVar89;
  short sVar92;
  short sVar96;
  short sVar100;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar114 [16];
  short sVar115;
  ushort uVar118;
  undefined1 auVar116 [16];
  short sVar119;
  undefined1 auVar117 [16];
  ushort uVar120;
  ushort uVar125;
  ushort uVar126;
  ushort uVar127;
  ushort uVar128;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  ushort uVar129;
  short sVar138;
  ushort uVar140;
  undefined1 auVar130 [12];
  ushort uVar135;
  ushort uVar136;
  ushort uVar137;
  ushort uVar139;
  ushort uVar141;
  undefined1 auVar131 [16];
  ushort uVar142;
  short sVar143;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  short sVar147;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  int iVar148;
  undefined1 auVar149 [12];
  int iVar157;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  int iVar158;
  int iVar159;
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  ushort uVar169;
  ushort uVar170;
  ushort uVar177;
  ushort uVar178;
  ushort uVar179;
  ushort uVar180;
  ushort uVar181;
  ushort uVar182;
  ushort uVar183;
  ushort uVar184;
  undefined1 auVar172 [12];
  undefined1 auVar176 [16];
  ushort uVar185;
  ushort uVar186;
  ushort uVar191;
  ushort uVar192;
  ushort uVar193;
  ushort uVar194;
  ushort uVar195;
  ushort uVar196;
  ushort uVar197;
  ushort uVar198;
  undefined1 auVar190 [16];
  short sVar204;
  short sVar205;
  short sVar206;
  short sVar207;
  short sVar208;
  short sVar209;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  short sVar210;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  int local_88;
  int aiStack_84 [5];
  undefined8 local_70;
  undefined1 local_68 [16];
  int thresh [4];
  undefined1 auVar79 [16];
  undefined1 auVar74 [12];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar75 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar132 [16];
  undefined1 auVar155 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined8 uVar171;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined8 uVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  
  auVar65 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  local_70 = CONCAT44((auVar65._4_4_ >> 0x10) + 2 >> 2,(auVar65._0_4_ >> 0x10) + 2 >> 2);
  lVar61 = 0;
  piVar63 = &local_88;
  piVar64 = (int *)&local_70;
  bVar56 = true;
  do {
    bVar57 = bVar56;
    *piVar63 = (dequant_ptr[lVar61] * 0x145 + 0x40 >> 7) + *piVar64 * 0x20 + -1;
    lVar61 = 1;
    piVar63 = aiStack_84;
    piVar64 = (int *)((long)&local_70 + 4);
    bVar56 = false;
  } while (bVar57);
  uVar125 = (ushort)(zbin_ptr[4] + 2U) >> 2;
  uVar126 = (ushort)(zbin_ptr[5] + 2U) >> 2;
  uVar127 = (ushort)(zbin_ptr[6] + 2U) >> 2;
  uVar128 = (ushort)(zbin_ptr[7] + 2U) >> 2;
  auVar101._8_4_ = 0xffffffff;
  auVar101._0_8_ = 0xffffffffffffffff;
  auVar101._12_4_ = 0xffffffff;
  sVar66 = uVar125 - 1;
  sVar67 = uVar126 - 1;
  sVar68 = uVar127 - 1;
  sVar69 = uVar128 - 1;
  auVar160 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar150 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc))
  ;
  sVar70 = auVar160._0_2_;
  sVar138 = -sVar70;
  sVar89 = auVar160._2_2_;
  sVar115 = -sVar89;
  sVar90 = auVar160._4_2_;
  sVar119 = -sVar90;
  sVar92 = auVar160._6_2_;
  sVar143 = -sVar92;
  sVar93 = auVar160._8_2_;
  sVar147 = -sVar93;
  sVar96 = auVar160._10_2_;
  sVar2 = -sVar96;
  sVar97 = auVar160._12_2_;
  sVar3 = -sVar97;
  sVar100 = auVar160._14_2_;
  sVar4 = -sVar100;
  uVar169 = (ushort)(sVar138 < sVar70) * sVar70 | (ushort)(sVar138 >= sVar70) * sVar138;
  uVar177 = (ushort)(sVar115 < sVar89) * sVar89 | (ushort)(sVar115 >= sVar89) * sVar115;
  uVar179 = (ushort)(sVar119 < sVar90) * sVar90 | (ushort)(sVar119 >= sVar90) * sVar119;
  uVar181 = (ushort)(sVar143 < sVar92) * sVar92 | (ushort)(sVar143 >= sVar92) * sVar143;
  uVar171 = CONCAT26(uVar181,CONCAT24(uVar179,CONCAT22(uVar177,uVar169)));
  uVar183 = (ushort)(sVar147 < sVar93) * sVar93 | (ushort)(sVar147 >= sVar93) * sVar147;
  auVar173._0_10_ = CONCAT28(uVar183,uVar171);
  auVar173._10_2_ = (ushort)(sVar2 < sVar96) * sVar96 | (ushort)(sVar2 >= sVar96) * sVar2;
  auVar173._12_2_ = (ushort)(sVar3 < sVar97) * sVar97 | (ushort)(sVar3 >= sVar97) * sVar3;
  auVar173._14_2_ = (ushort)(sVar4 < sVar100) * sVar100 | (ushort)(sVar4 >= sVar100) * sVar4;
  sVar70 = auVar150._0_2_;
  sVar138 = -sVar70;
  sVar89 = auVar150._2_2_;
  sVar115 = -sVar89;
  sVar90 = auVar150._4_2_;
  sVar119 = -sVar90;
  sVar92 = auVar150._6_2_;
  sVar143 = -sVar92;
  sVar93 = auVar150._8_2_;
  sVar147 = -sVar93;
  sVar96 = auVar150._10_2_;
  sVar2 = -sVar96;
  sVar97 = auVar150._12_2_;
  sVar3 = -sVar97;
  sVar100 = auVar150._14_2_;
  sVar4 = -sVar100;
  uVar185 = (ushort)(sVar138 < sVar70) * sVar70 | (ushort)(sVar138 >= sVar70) * sVar138;
  uVar191 = (ushort)(sVar115 < sVar89) * sVar89 | (ushort)(sVar115 >= sVar89) * sVar115;
  uVar193 = (ushort)(sVar119 < sVar90) * sVar90 | (ushort)(sVar119 >= sVar90) * sVar119;
  uVar195 = (ushort)(sVar143 < sVar92) * sVar92 | (ushort)(sVar143 >= sVar92) * sVar143;
  uVar187 = CONCAT26(uVar195,CONCAT24(uVar193,CONCAT22(uVar191,uVar185)));
  uVar197 = (ushort)(sVar147 < sVar93) * sVar93 | (ushort)(sVar147 >= sVar93) * sVar147;
  auVar188._0_10_ = CONCAT28(uVar197,uVar187);
  auVar188._10_2_ = (ushort)(sVar2 < sVar96) * sVar96 | (ushort)(sVar2 >= sVar96) * sVar2;
  auVar188._12_2_ = (ushort)(sVar3 < sVar97) * sVar97 | (ushort)(sVar3 >= sVar97) * sVar3;
  auVar188._14_2_ = (ushort)(sVar4 < sVar100) * sVar100 | (ushort)(sVar4 >= sVar100) * sVar4;
  auVar5._10_2_ = 0;
  auVar5._0_10_ = auVar173._0_10_;
  auVar5._12_2_ = uVar181;
  auVar10._8_2_ = uVar179;
  auVar10._0_8_ = uVar171;
  auVar10._10_4_ = auVar5._10_4_;
  auVar42._6_8_ = 0;
  auVar42._0_6_ = auVar10._8_6_;
  auVar22._4_2_ = uVar177;
  auVar22._0_4_ = CONCAT22(uVar177,uVar169);
  auVar22._6_8_ = SUB148(auVar42 << 0x40,6);
  auVar6._10_2_ = 0;
  auVar6._0_10_ = auVar188._0_10_;
  auVar6._12_2_ = uVar195;
  auVar11._8_2_ = uVar193;
  auVar11._0_8_ = uVar187;
  auVar11._10_4_ = auVar6._10_4_;
  auVar43._6_8_ = 0;
  auVar43._0_6_ = auVar11._8_6_;
  auVar23._4_2_ = uVar191;
  auVar23._0_4_ = CONCAT22(uVar191,uVar185);
  auVar23._6_8_ = SUB148(auVar43 << 0x40,6);
  auVar116._0_4_ = -(uint)(local_88 < (int)((uint)uVar169 << 5));
  auVar116._4_4_ = -(uint)(aiStack_84[0] < auVar22._4_4_ << 5);
  auVar116._8_4_ = -(uint)(aiStack_84[0] < auVar10._8_4_ << 5);
  auVar116._12_4_ = -(uint)(aiStack_84[0] < (int)((auVar5._10_4_ >> 0x10) << 5));
  auVar65._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar183 << 5));
  auVar65._4_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar173._10_2_ << 5));
  auVar65._8_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar173._12_2_ << 5));
  auVar65._12_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar173._14_2_ << 5));
  auVar116 = packssdw(auVar116,auVar65);
  auVar104._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar185 << 5));
  auVar104._4_4_ = -(uint)(aiStack_84[0] < auVar23._4_4_ << 5);
  auVar104._8_4_ = -(uint)(aiStack_84[0] < auVar11._8_4_ << 5);
  auVar104._12_4_ = -(uint)(aiStack_84[0] < (int)((auVar6._10_4_ >> 0x10) << 5));
  auVar131._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar197 << 5));
  auVar131._4_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar188._10_2_ << 5));
  auVar131._8_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar188._12_2_ << 5));
  auVar131._12_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar188._14_2_ << 5));
  auVar131 = packssdw(auVar104,auVar131);
  auVar65 = auVar131 | auVar116;
  uVar129 = 0;
  uVar135 = 0;
  uVar136 = 0;
  uVar137 = 0;
  uVar139 = 0;
  uVar140 = 0;
  uVar141 = 0;
  uVar142 = 0;
  bVar39 = (auVar65 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar40 = (auVar65 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar38 = (auVar65 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = (auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar36 = (auVar65 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar35 = (auVar65 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar34 = (auVar65 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar33 = (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar32 = (auVar65 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar31 = (auVar65 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar30 = (auVar65 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar29 = (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar27 = (auVar65 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar65 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar57 = (auVar65 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar56 = auVar65[0xf] < '\0';
  if (((((((((((((((bVar39 || bVar40) || bVar38) || bVar37) || bVar36) || bVar35) || bVar34) ||
             bVar33) || bVar32) || bVar31) || bVar30) || bVar29) || bVar27) || bVar18) || bVar57) ||
      bVar56) {
    auVar116 = auVar116 & *(undefined1 (*) [16])iscan;
    auVar131 = auVar131 & *(undefined1 (*) [16])(iscan + 8);
    sVar138 = auVar116._0_2_;
    sVar115 = auVar131._0_2_;
    uVar129 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar116._2_2_;
    sVar115 = auVar131._2_2_;
    uVar135 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar116._4_2_;
    sVar115 = auVar131._4_2_;
    uVar136 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar116._6_2_;
    sVar115 = auVar131._6_2_;
    uVar137 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar116._8_2_;
    sVar115 = auVar131._8_2_;
    uVar139 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar116._10_2_;
    sVar115 = auVar131._10_2_;
    uVar140 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar116._12_2_;
    sVar115 = auVar131._12_2_;
    sVar119 = auVar131._14_2_;
    uVar141 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar116._14_2_;
    uVar142 = (ushort)(sVar119 < sVar138) * sVar138 | (ushort)(sVar119 >= sVar138) * sVar119;
  }
  bVar56 = ((((((((((((((bVar39 || bVar40) || bVar38) || bVar37) || bVar36) || bVar35) || bVar34) ||
                  bVar33) || bVar32) || bVar31) || bVar30) || bVar29) || bVar27) || bVar18) ||
           bVar57) || bVar56;
  auVar65 = *(undefined1 (*) [16])quant_ptr;
  auVar131 = *(undefined1 (*) [16])dequant_ptr;
  auVar116 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar73._0_2_ = (ushort)(*round_ptr + 2U) >> 2;
  auVar73._2_2_ = (ushort)(round_ptr[1] + 2U) >> 2;
  auVar73._4_2_ = (ushort)(round_ptr[2] + 2U) >> 2;
  auVar73._6_2_ = (ushort)(round_ptr[3] + 2U) >> 2;
  auVar73._8_2_ = (ushort)(round_ptr[4] + 2U) >> 2;
  auVar73._10_2_ = (ushort)(round_ptr[5] + 2U) >> 2;
  auVar75._12_2_ = (ushort)(round_ptr[6] + 2U) >> 2;
  auVar75._0_12_ = auVar73;
  auVar75._14_2_ = (ushort)(round_ptr[7] + 2U) >> 2;
  auVar121._0_2_ = -(ushort)((short)uVar169 < (short)((ushort)(*zbin_ptr + 2U) >> 2));
  auVar121._2_2_ = -(ushort)((short)uVar177 < (short)((ushort)(zbin_ptr[1] + 2U) >> 2));
  auVar121._4_2_ = -(ushort)((short)uVar179 < (short)((ushort)(zbin_ptr[2] + 2U) >> 2));
  auVar121._6_2_ = -(ushort)((short)uVar181 < (short)((ushort)(zbin_ptr[3] + 2U) >> 2));
  auVar121._8_2_ = -(ushort)((short)uVar183 < (short)uVar125);
  auVar121._10_2_ = -(ushort)((short)auVar173._10_2_ < (short)uVar126);
  auVar121._12_2_ = -(ushort)((short)auVar173._12_2_ < (short)uVar127);
  auVar121._14_2_ = -(ushort)((short)auVar173._14_2_ < (short)uVar128);
  auVar211._0_2_ = -(ushort)(sVar66 < (short)uVar185);
  auVar211._2_2_ = -(ushort)(sVar67 < (short)uVar191);
  auVar211._4_2_ = -(ushort)(sVar68 < (short)uVar193);
  auVar211._6_2_ = -(ushort)(sVar69 < (short)uVar195);
  auVar211._8_2_ = -(ushort)(sVar66 < (short)uVar197);
  auVar211._10_2_ = -(ushort)(sVar67 < (short)auVar188._10_2_);
  auVar211._12_2_ = -(ushort)(sVar68 < (short)auVar188._12_2_);
  auVar211._14_2_ = -(ushort)(sVar69 < (short)auVar188._14_2_);
  auVar104 = auVar211 | auVar101 ^ auVar121;
  bVar40 = (auVar104 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar41 = (auVar104 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar39 = (auVar104 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar38 = (auVar104 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar37 = (auVar104 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar36 = (auVar104 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar35 = (auVar104 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar34 = (auVar104 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar33 = (auVar104 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar32 = (auVar104 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar31 = (auVar104 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar30 = (auVar104 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar29 = (auVar104 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar27 = (auVar104 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar18 = (auVar104 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar57 = -1 < auVar104[0xf];
  uVar94 = auVar73._8_4_;
  uVar98 = auVar75._12_4_;
  local_68._0_8_ = auVar65._8_8_;
  auVar103._0_8_ = auVar116._8_8_;
  auVar124._0_8_ = auVar131._8_8_;
  if (((((((((((((((bVar40 && bVar41) && bVar39) && bVar38) && bVar37) && bVar36) && bVar35) &&
             bVar34) && bVar33) && bVar32) && bVar31) && bVar30) && bVar29) && bVar27) && bVar18) &&
      bVar57) {
    iVar148 = 0;
    iVar157 = 0;
    iVar158 = 0;
    iVar159 = 0;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    auVar150._4_4_ = uVar98;
    auVar150._0_4_ = uVar94;
    auVar150._8_4_ = uVar94;
    auVar150._12_4_ = uVar98;
    local_68._8_4_ = auVar65._8_4_;
    local_68._12_4_ = auVar65._12_4_;
    auVar103._8_4_ = auVar116._8_4_;
    auVar103._12_4_ = auVar116._12_4_;
    auVar124._8_4_ = auVar131._8_4_;
    auVar124._12_4_ = auVar131._12_4_;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    iVar72 = 0;
    iVar91 = 0;
    iVar95 = 0;
    iVar99 = 0;
    uVar126 = 0;
    uVar125 = 0;
    uVar181 = 0;
    uVar179 = 0;
    uVar177 = 0;
    uVar169 = 0;
    uVar128 = 0;
    uVar127 = 0;
  }
  else {
    auVar161 = psraw(auVar160,0xf);
    auVar151 = psraw(auVar150,0xf);
    auVar101 = (auVar101 ^ auVar121) & *(undefined1 (*) [16])iscan;
    auVar104 = *(undefined1 (*) [16])(iscan + 8) & auVar211;
    sVar138 = auVar101._0_2_;
    sVar115 = auVar104._0_2_;
    uVar126 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar101._2_2_;
    sVar115 = auVar104._2_2_;
    uVar125 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar101._4_2_;
    sVar115 = auVar104._4_2_;
    uVar181 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar101._6_2_;
    sVar115 = auVar104._6_2_;
    uVar179 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar101._8_2_;
    sVar115 = auVar104._8_2_;
    uVar177 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar101._10_2_;
    sVar115 = auVar104._10_2_;
    uVar169 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar101._12_2_;
    sVar115 = auVar104._12_2_;
    sVar119 = auVar104._14_2_;
    uVar128 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
    sVar138 = auVar101._14_2_;
    uVar127 = (ushort)(sVar119 < sVar138) * sVar138 | (ushort)(sVar119 >= sVar138) * sVar119;
    uVar126 = (-1 < (short)uVar126) * uVar126;
    uVar125 = (-1 < (short)uVar125) * uVar125;
    uVar181 = (-1 < (short)uVar181) * uVar181;
    uVar179 = (-1 < (short)uVar179) * uVar179;
    uVar177 = (-1 < (short)uVar177) * uVar177;
    uVar169 = (-1 < (short)uVar169) * uVar169;
    uVar128 = (-1 < (short)uVar128) * uVar128;
    uVar127 = (-1 < (short)uVar127) * uVar127;
    auVar104 = paddsw(auVar173,auVar75);
    auVar101 = pmulhw(auVar104,auVar65);
    auVar105._0_2_ = auVar101._0_2_ + auVar104._0_2_;
    auVar105._2_2_ = auVar101._2_2_ + auVar104._2_2_;
    auVar105._4_2_ = auVar101._4_2_ + auVar104._4_2_;
    auVar105._6_2_ = auVar101._6_2_ + auVar104._6_2_;
    auVar105._8_2_ = auVar101._8_2_ + auVar104._8_2_;
    auVar105._10_2_ = auVar101._10_2_ + auVar104._10_2_;
    auVar105._12_2_ = auVar101._12_2_ + auVar104._12_2_;
    auVar105._14_2_ = auVar101._14_2_ + auVar104._14_2_;
    sVar138 = auVar116._8_2_;
    sVar115 = auVar116._10_2_;
    sVar119 = auVar116._12_2_;
    sVar143 = auVar116._14_2_;
    auVar101 = pmulhw(auVar105,auVar116);
    auVar102._0_2_ = (ushort)(auVar105._0_2_ * auVar116._0_2_) >> 0xe;
    auVar102._2_2_ = (ushort)(auVar105._2_2_ * auVar116._2_2_) >> 0xe;
    auVar102._4_2_ = (ushort)(auVar105._4_2_ * auVar116._4_2_) >> 0xe;
    auVar102._6_2_ = (ushort)(auVar105._6_2_ * auVar116._6_2_) >> 0xe;
    auVar102._8_2_ = (ushort)(auVar105._8_2_ * sVar138) >> 0xe;
    auVar102._10_2_ = (ushort)(auVar105._10_2_ * sVar115) >> 0xe;
    auVar102._12_2_ = (ushort)(auVar105._12_2_ * sVar119) >> 0xe;
    auVar102._14_2_ = (ushort)(auVar105._14_2_ * sVar143) >> 0xe;
    auVar101 = psllw(auVar101,2);
    auVar150._4_4_ = uVar98;
    auVar150._0_4_ = uVar94;
    auVar150._8_4_ = uVar94;
    auVar150._12_4_ = uVar98;
    local_68._8_4_ = auVar65._8_4_;
    local_68._12_4_ = auVar65._12_4_;
    auVar103._8_4_ = auVar116._8_4_;
    auVar103._12_4_ = auVar116._12_4_;
    auVar65 = paddsw(auVar188,auVar150);
    auVar116 = pmulhw(auVar65,local_68);
    auVar199._0_2_ = auVar116._0_2_ + auVar65._0_2_;
    auVar199._2_2_ = auVar116._2_2_ + auVar65._2_2_;
    auVar199._4_2_ = auVar116._4_2_ + auVar65._4_2_;
    auVar199._6_2_ = auVar116._6_2_ + auVar65._6_2_;
    auVar199._8_2_ = auVar116._8_2_ + auVar65._8_2_;
    auVar199._10_2_ = auVar116._10_2_ + auVar65._10_2_;
    auVar199._12_2_ = auVar116._12_2_ + auVar65._12_2_;
    auVar199._14_2_ = auVar116._14_2_ + auVar65._14_2_;
    auVar65 = pmulhw(auVar199,auVar103);
    auVar160._0_2_ = (ushort)(auVar199._0_2_ * sVar138) >> 0xe;
    auVar160._2_2_ = (ushort)(auVar199._2_2_ * sVar115) >> 0xe;
    auVar160._4_2_ = (ushort)(auVar199._4_2_ * sVar119) >> 0xe;
    auVar160._6_2_ = (ushort)(auVar199._6_2_ * sVar143) >> 0xe;
    auVar160._8_2_ = (ushort)(auVar199._8_2_ * sVar138) >> 0xe;
    auVar160._10_2_ = (ushort)(auVar199._10_2_ * sVar115) >> 0xe;
    auVar160._12_2_ = (ushort)(auVar199._12_2_ * sVar119) >> 0xe;
    auVar160._14_2_ = (ushort)(auVar199._14_2_ * sVar143) >> 0xe;
    auVar116 = psllw(auVar65,2);
    auVar65 = (auVar101 | auVar102) ^ auVar161;
    auVar122._0_2_ = auVar65._0_2_ - auVar161._0_2_;
    auVar122._2_2_ = auVar65._2_2_ - auVar161._2_2_;
    auVar122._4_2_ = auVar65._4_2_ - auVar161._4_2_;
    auVar122._6_2_ = auVar65._6_2_ - auVar161._6_2_;
    auVar122._8_2_ = auVar65._8_2_ - auVar161._8_2_;
    auVar122._10_2_ = auVar65._10_2_ - auVar161._10_2_;
    auVar122._12_2_ = auVar65._12_2_ - auVar161._12_2_;
    auVar122._14_2_ = auVar65._14_2_ - auVar161._14_2_;
    auVar65 = (auVar116 | auVar160) ^ auVar151;
    auVar200._0_2_ = auVar65._0_2_ - auVar151._0_2_;
    auVar200._2_2_ = auVar65._2_2_ - auVar151._2_2_;
    auVar200._4_2_ = auVar65._4_2_ - auVar151._4_2_;
    auVar200._6_2_ = auVar65._6_2_ - auVar151._6_2_;
    auVar200._8_2_ = auVar65._8_2_ - auVar151._8_2_;
    auVar200._10_2_ = auVar65._10_2_ - auVar151._10_2_;
    auVar200._12_2_ = auVar65._12_2_ - auVar151._12_2_;
    auVar200._14_2_ = auVar65._14_2_ - auVar151._14_2_;
    auVar122 = ~auVar121 & auVar122;
    auVar200 = auVar200 & auVar211;
    auVar65 = psraw(auVar122,0xf);
    sVar90 = auVar122._6_2_;
    auVar151._0_12_ = auVar122._0_12_;
    auVar151._12_2_ = sVar90;
    auVar151._14_2_ = auVar65._6_2_;
    auVar77._12_4_ = auVar151._12_4_;
    auVar77._0_10_ = auVar122._0_10_;
    auVar77._10_2_ = auVar65._4_2_;
    sVar89 = auVar122._4_2_;
    auVar76._10_6_ = auVar77._10_6_;
    auVar76._0_8_ = auVar122._0_8_;
    auVar76._8_2_ = sVar89;
    auVar161._8_8_ = auVar76._8_8_;
    auVar161._6_2_ = auVar65._2_2_;
    sVar70 = auVar122._2_2_;
    auVar161._4_2_ = sVar70;
    auVar161._0_2_ = auVar122._0_2_;
    auVar161._2_2_ = auVar65._0_2_;
    sVar92 = auVar122._8_2_;
    sVar93 = auVar122._10_2_;
    uVar183 = auVar65._10_2_;
    sVar96 = auVar122._12_2_;
    uVar185 = auVar65._12_2_;
    sVar97 = auVar122._14_2_;
    uVar191 = auVar65._14_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar161;
    *(short *)(qcoeff_ptr + 4) = sVar92;
    *(ushort *)((long)qcoeff_ptr + 0x12) = auVar65._8_2_;
    *(short *)(qcoeff_ptr + 5) = sVar93;
    *(ushort *)((long)qcoeff_ptr + 0x16) = uVar183;
    *(short *)(qcoeff_ptr + 6) = sVar96;
    *(ushort *)((long)qcoeff_ptr + 0x1a) = uVar185;
    *(short *)(qcoeff_ptr + 7) = sVar97;
    *(ushort *)((long)qcoeff_ptr + 0x1e) = uVar191;
    sVar100 = auVar200._0_2_;
    sVar138 = -sVar100;
    sVar204 = auVar200._2_2_;
    sVar115 = -sVar204;
    sVar205 = auVar200._4_2_;
    sVar119 = -sVar205;
    sVar206 = auVar200._6_2_;
    sVar143 = -sVar206;
    sVar207 = auVar200._8_2_;
    sVar147 = -sVar207;
    sVar208 = auVar200._10_2_;
    sVar2 = -sVar208;
    sVar209 = auVar200._12_2_;
    sVar3 = -sVar209;
    sVar210 = auVar200._14_2_;
    sVar4 = -sVar210;
    auVar106._0_2_ = (ushort)(sVar138 < sVar100) * sVar100 | (ushort)(sVar138 >= sVar100) * sVar138;
    auVar106._2_2_ = (ushort)(sVar115 < sVar204) * sVar204 | (ushort)(sVar115 >= sVar204) * sVar115;
    auVar106._4_2_ = (ushort)(sVar119 < sVar205) * sVar205 | (ushort)(sVar119 >= sVar205) * sVar119;
    auVar106._6_2_ = (ushort)(sVar143 < sVar206) * sVar206 | (ushort)(sVar143 >= sVar206) * sVar143;
    auVar106._8_2_ = (ushort)(sVar147 < sVar207) * sVar207 | (ushort)(sVar147 >= sVar207) * sVar147;
    auVar106._10_2_ = (ushort)(sVar2 < sVar208) * sVar208 | (ushort)(sVar2 >= sVar208) * sVar2;
    auVar106._12_2_ = (ushort)(sVar3 < sVar209) * sVar209 | (ushort)(sVar3 >= sVar209) * sVar3;
    auVar106._14_2_ = (ushort)(sVar4 < sVar210) * sVar210 | (ushort)(sVar4 >= sVar210) * sVar4;
    auVar101 = psraw(auVar200,0xf);
    auVar81._0_12_ = auVar200._0_12_;
    auVar81._12_2_ = sVar206;
    auVar81._14_2_ = auVar101._6_2_;
    auVar80._12_4_ = auVar81._12_4_;
    auVar80._0_10_ = auVar200._0_10_;
    auVar80._10_2_ = auVar101._4_2_;
    auVar79._10_6_ = auVar80._10_6_;
    auVar79._0_8_ = auVar200._0_8_;
    auVar79._8_2_ = sVar205;
    auVar78._8_8_ = auVar79._8_8_;
    auVar78._6_2_ = auVar101._2_2_;
    auVar78._4_2_ = sVar204;
    auVar78._2_2_ = auVar101._0_2_;
    auVar78._0_2_ = sVar100;
    uVar193 = auVar101._10_2_;
    uVar195 = auVar101._12_2_;
    uVar197 = auVar101._14_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar78;
    *(short *)(qcoeff_ptr + 0xc) = sVar207;
    *(ushort *)((long)qcoeff_ptr + 0x32) = auVar101._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = sVar208;
    *(ushort *)((long)qcoeff_ptr + 0x36) = uVar193;
    *(short *)(qcoeff_ptr + 0xe) = sVar209;
    *(ushort *)((long)qcoeff_ptr + 0x3a) = uVar195;
    *(short *)(qcoeff_ptr + 0xf) = sVar210;
    *(ushort *)((long)qcoeff_ptr + 0x3e) = uVar197;
    sVar138 = -auVar161._0_2_;
    sVar115 = -sVar70;
    sVar119 = -sVar89;
    sVar143 = -sVar90;
    sVar147 = -sVar92;
    sVar2 = -sVar93;
    sVar3 = -sVar96;
    sVar4 = -sVar97;
    auVar82._0_2_ =
         (ushort)(sVar138 < auVar161._0_2_) * auVar161._0_2_ |
         (ushort)(sVar138 >= auVar161._0_2_) * sVar138;
    auVar82._2_2_ = (ushort)(sVar115 < sVar70) * sVar70 | (ushort)(sVar115 >= sVar70) * sVar115;
    auVar82._4_2_ = (ushort)(sVar119 < sVar89) * sVar89 | (ushort)(sVar119 >= sVar89) * sVar119;
    auVar82._6_2_ = (ushort)(sVar143 < sVar90) * sVar90 | (ushort)(sVar143 >= sVar90) * sVar143;
    auVar82._8_2_ = (ushort)(sVar147 < sVar92) * sVar92 | (ushort)(sVar147 >= sVar92) * sVar147;
    auVar82._10_2_ = (ushort)(sVar2 < sVar93) * sVar93 | (ushort)(sVar2 >= sVar93) * sVar2;
    auVar82._12_2_ = (ushort)(sVar3 < sVar96) * sVar96 | (ushort)(sVar3 >= sVar96) * sVar3;
    auVar82._14_2_ = (ushort)(sVar4 < sVar97) * sVar97 | (ushort)(sVar4 >= sVar97) * sVar4;
    auVar12._10_2_ = 0;
    auVar12._0_10_ = auVar65._0_10_;
    auVar12._12_2_ = auVar65._6_2_;
    auVar19._8_2_ = auVar65._4_2_;
    auVar19._0_8_ = auVar65._0_8_;
    auVar19._10_4_ = auVar12._10_4_;
    auVar44._6_8_ = 0;
    auVar44._0_6_ = auVar19._8_6_;
    Var45 = CONCAT82(SUB148(auVar44 << 0x40,6),auVar65._2_2_);
    auVar123._0_4_ = CONCAT22(0,auVar65._0_2_);
    auVar123._4_10_ = Var45;
    auVar123._14_2_ = 0;
    auVar152._0_4_ = CONCAT22(0,auVar65._8_2_);
    auVar152._4_2_ = uVar183;
    auVar152._6_2_ = 0;
    auVar152._8_2_ = uVar185;
    auVar152._10_2_ = 0;
    auVar152._12_2_ = uVar191;
    auVar152._14_2_ = 0;
    sVar138 = auVar82._6_2_ * auVar131._6_2_;
    sVar115 = auVar131._8_2_;
    sVar119 = auVar131._10_2_;
    sVar143 = auVar131._12_2_;
    sVar147 = auVar131._14_2_;
    auVar65 = pmulhw(auVar82,auVar131);
    uVar59 = CONCAT22(auVar65._6_2_,sVar138);
    Var55 = CONCAT64(CONCAT42(uVar59,auVar65._4_2_),CONCAT22(auVar82._4_2_ * auVar131._4_2_,sVar138)
                    );
    auVar46._4_8_ = (long)((unkuint10)Var55 >> 0x10);
    auVar46._2_2_ = auVar65._2_2_;
    auVar46._0_2_ = auVar82._2_2_ * auVar131._2_2_;
    uVar71 = CONCAT22(auVar65._8_2_,auVar82._8_2_ * sVar115);
    auVar130._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(auVar82._10_2_ * sVar119,uVar71));
    auVar130._8_2_ = auVar82._12_2_ * sVar143;
    auVar130._10_2_ = auVar65._12_2_;
    auVar132._12_2_ = auVar82._14_2_ * sVar147;
    auVar132._0_12_ = auVar130;
    auVar132._14_2_ = auVar65._14_2_;
    auVar162._0_4_ = CONCAT22(auVar65._0_2_,auVar82._0_2_ * auVar131._0_2_) >> 2;
    auVar162._4_4_ = auVar46._0_4_ >> 2;
    auVar162._8_4_ = (uint)((unkuint10)Var55 >> 0x10) >> 2;
    auVar162._12_4_ = uVar59 >> 2;
    auVar133._0_4_ = uVar71 >> 2;
    auVar133._4_4_ = (uint)((ulong)auVar130._0_8_ >> 0x22);
    auVar133._8_4_ = auVar130._8_4_ >> 2;
    auVar133._12_4_ = auVar132._12_4_ >> 2;
    auVar162 = auVar162 ^ auVar123;
    auVar133 = auVar133 ^ auVar152;
    *dqcoeff_ptr = auVar162._0_4_ - auVar123._0_4_;
    dqcoeff_ptr[1] = auVar162._4_4_ - (int)Var45;
    dqcoeff_ptr[2] = auVar162._8_4_ - auVar19._8_4_;
    dqcoeff_ptr[3] = auVar162._12_4_ - (auVar12._10_4_ >> 0x10);
    dqcoeff_ptr[4] = auVar133._0_4_ - auVar152._0_4_;
    dqcoeff_ptr[5] = auVar133._4_4_ - (uint)uVar183;
    dqcoeff_ptr[6] = auVar133._8_4_ - (uint)uVar185;
    dqcoeff_ptr[7] = auVar133._12_4_ - (uint)uVar191;
    auVar124._8_4_ = auVar131._8_4_;
    auVar124._12_4_ = auVar131._12_4_;
    auVar13._10_2_ = 0;
    auVar13._0_10_ = auVar101._0_10_;
    auVar13._12_2_ = auVar101._6_2_;
    auVar20._8_2_ = auVar101._4_2_;
    auVar20._0_8_ = auVar101._0_8_;
    auVar20._10_4_ = auVar13._10_4_;
    auVar47._6_8_ = 0;
    auVar47._0_6_ = auVar20._8_6_;
    Var45 = CONCAT82(SUB148(auVar47 << 0x40,6),auVar101._2_2_);
    auVar134._0_4_ = CONCAT22(0,auVar101._0_2_);
    auVar134._4_10_ = Var45;
    auVar134._14_2_ = 0;
    auVar201._0_4_ = CONCAT22(0,auVar101._8_2_);
    auVar201._4_2_ = uVar193;
    auVar201._6_2_ = 0;
    auVar201._8_2_ = uVar195;
    auVar201._10_2_ = 0;
    auVar201._12_2_ = uVar197;
    auVar201._14_2_ = 0;
    auVar65 = pmulhw(auVar106,auVar124);
    uVar59 = CONCAT22(auVar65._6_2_,auVar106._6_2_ * sVar147);
    Var55 = CONCAT64(CONCAT42(uVar59,auVar65._4_2_),
                     CONCAT22(auVar106._4_2_ * sVar143,auVar106._6_2_ * sVar147));
    auVar48._4_8_ = (long)((unkuint10)Var55 >> 0x10);
    auVar48._2_2_ = auVar65._2_2_;
    auVar48._0_2_ = auVar106._2_2_ * sVar119;
    uVar71 = CONCAT22(auVar65._8_2_,auVar106._8_2_ * sVar115);
    auVar74._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(auVar106._10_2_ * sVar119,uVar71));
    auVar74._8_2_ = auVar106._12_2_ * sVar143;
    auVar74._10_2_ = auVar65._12_2_;
    auVar83._12_2_ = auVar106._14_2_ * sVar147;
    auVar83._0_12_ = auVar74;
    auVar83._14_2_ = auVar65._14_2_;
    auVar153._0_4_ = CONCAT22(auVar65._0_2_,auVar106._0_2_ * sVar115) >> 2;
    auVar153._4_4_ = auVar48._0_4_ >> 2;
    auVar153._8_4_ = (uint)((unkuint10)Var55 >> 0x10) >> 2;
    auVar153._12_4_ = uVar59 >> 2;
    auVar84._0_4_ = uVar71 >> 2;
    auVar84._4_4_ = (uint)((ulong)auVar74._0_8_ >> 0x22);
    auVar84._8_4_ = auVar74._8_4_ >> 2;
    auVar84._12_4_ = auVar83._12_4_ >> 2;
    auVar153 = auVar153 ^ auVar134;
    iVar148 = auVar153._0_4_ - auVar134._0_4_;
    iVar157 = auVar153._4_4_ - (int)Var45;
    iVar158 = auVar153._8_4_ - auVar20._8_4_;
    iVar159 = auVar153._12_4_ - (auVar13._10_4_ >> 0x10);
    auVar84 = auVar84 ^ auVar201;
    iVar72 = auVar84._0_4_ - auVar201._0_4_;
    iVar91 = auVar84._4_4_ - (uint)uVar193;
    iVar95 = auVar84._8_4_ - (uint)uVar195;
    iVar99 = auVar84._12_4_ - (uint)uVar197;
  }
  bVar57 = ((((((((((((((!bVar40 || !bVar41) || !bVar39) || !bVar38) || !bVar37) || !bVar36) ||
                   !bVar35) || !bVar34) || !bVar33) || !bVar32) || !bVar31) || !bVar30) || !bVar29)
            || !bVar27) || !bVar18) || !bVar57;
  uVar129 = (-1 < (short)uVar129) * uVar129;
  uVar135 = (-1 < (short)uVar135) * uVar135;
  uVar136 = (-1 < (short)uVar136) * uVar136;
  uVar137 = (-1 < (short)uVar137) * uVar137;
  uVar139 = (-1 < (short)uVar139) * uVar139;
  uVar140 = (-1 < (short)uVar140) * uVar140;
  uVar141 = (-1 < (short)uVar141) * uVar141;
  uVar142 = (-1 < (short)uVar142) * uVar142;
  dqcoeff_ptr[8] = iVar148;
  dqcoeff_ptr[9] = iVar157;
  dqcoeff_ptr[10] = iVar158;
  dqcoeff_ptr[0xb] = iVar159;
  dqcoeff_ptr[0xc] = iVar72;
  dqcoeff_ptr[0xd] = iVar91;
  dqcoeff_ptr[0xe] = iVar95;
  dqcoeff_ptr[0xf] = iVar99;
  if (0x10 < n_coeffs) {
    iVar72 = 0x10;
    lVar61 = 0x10;
    bVar18 = bVar57;
    do {
      bVar57 = bVar18;
      lVar62 = (long)iVar72;
      while( true ) {
        iVar72 = iVar72 + 0x10;
        auVar131 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar61),
                            *(undefined1 (*) [16])(coeff_ptr + lVar61 + 4));
        auVar116 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar61 + 8),
                            *(undefined1 (*) [16])(coeff_ptr + lVar61 + 0xc));
        uVar183 = 0;
        uVar185 = 0;
        uVar191 = 0;
        uVar193 = 0;
        uVar195 = 0;
        uVar197 = 0;
        uVar118 = 0;
        uVar120 = 0;
        sVar70 = auVar131._0_2_;
        sVar138 = -sVar70;
        sVar89 = auVar131._2_2_;
        sVar115 = -sVar89;
        sVar90 = auVar131._4_2_;
        sVar119 = -sVar90;
        sVar92 = auVar131._6_2_;
        sVar143 = -sVar92;
        sVar93 = auVar131._8_2_;
        sVar147 = -sVar93;
        sVar96 = auVar131._10_2_;
        sVar2 = -sVar96;
        sVar97 = auVar131._12_2_;
        sVar3 = -sVar97;
        sVar100 = auVar131._14_2_;
        sVar4 = -sVar100;
        uVar186 = (ushort)(sVar138 < sVar70) * sVar70 | (ushort)(sVar138 >= sVar70) * sVar138;
        uVar192 = (ushort)(sVar115 < sVar89) * sVar89 | (ushort)(sVar115 >= sVar89) * sVar115;
        uVar194 = (ushort)(sVar119 < sVar90) * sVar90 | (ushort)(sVar119 >= sVar90) * sVar119;
        uVar196 = (ushort)(sVar143 < sVar92) * sVar92 | (ushort)(sVar143 >= sVar92) * sVar143;
        uVar187 = CONCAT26(uVar196,CONCAT24(uVar194,CONCAT22(uVar192,uVar186)));
        uVar198 = (ushort)(sVar147 < sVar93) * sVar93 | (ushort)(sVar147 >= sVar93) * sVar147;
        auVar189._0_10_ = CONCAT28(uVar198,uVar187);
        auVar189._10_2_ = (ushort)(sVar2 < sVar96) * sVar96 | (ushort)(sVar2 >= sVar96) * sVar2;
        auVar189._12_2_ = (ushort)(sVar3 < sVar97) * sVar97 | (ushort)(sVar3 >= sVar97) * sVar3;
        auVar189._14_2_ = (ushort)(sVar4 < sVar100) * sVar100 | (ushort)(sVar4 >= sVar100) * sVar4;
        sVar70 = auVar116._0_2_;
        sVar138 = -sVar70;
        sVar89 = auVar116._2_2_;
        sVar115 = -sVar89;
        sVar90 = auVar116._4_2_;
        sVar119 = -sVar90;
        sVar92 = auVar116._6_2_;
        sVar143 = -sVar92;
        sVar93 = auVar116._8_2_;
        sVar147 = -sVar93;
        sVar96 = auVar116._10_2_;
        sVar2 = -sVar96;
        sVar97 = auVar116._12_2_;
        sVar3 = -sVar97;
        sVar100 = auVar116._14_2_;
        sVar4 = -sVar100;
        uVar170 = (ushort)(sVar138 < sVar70) * sVar70 | (ushort)(sVar138 >= sVar70) * sVar138;
        uVar178 = (ushort)(sVar115 < sVar89) * sVar89 | (ushort)(sVar115 >= sVar89) * sVar115;
        uVar180 = (ushort)(sVar119 < sVar90) * sVar90 | (ushort)(sVar119 >= sVar90) * sVar119;
        uVar182 = (ushort)(sVar143 < sVar92) * sVar92 | (ushort)(sVar143 >= sVar92) * sVar143;
        uVar171 = CONCAT26(uVar182,CONCAT24(uVar180,CONCAT22(uVar178,uVar170)));
        uVar184 = (ushort)(sVar147 < sVar93) * sVar93 | (ushort)(sVar147 >= sVar93) * sVar147;
        auVar174._0_10_ = CONCAT28(uVar184,uVar171);
        auVar174._10_2_ = (ushort)(sVar2 < sVar96) * sVar96 | (ushort)(sVar2 >= sVar96) * sVar2;
        auVar174._12_2_ = (ushort)(sVar3 < sVar97) * sVar97 | (ushort)(sVar3 >= sVar97) * sVar3;
        auVar174._14_2_ = (ushort)(sVar4 < sVar100) * sVar100 | (ushort)(sVar4 >= sVar100) * sVar4;
        auVar14._10_2_ = 0;
        auVar14._0_10_ = auVar189._0_10_;
        auVar14._12_2_ = uVar196;
        auVar21._8_2_ = uVar194;
        auVar21._0_8_ = uVar187;
        auVar21._10_4_ = auVar14._10_4_;
        auVar49._6_8_ = 0;
        auVar49._0_6_ = auVar21._8_6_;
        auVar28._4_2_ = uVar192;
        auVar28._0_4_ = CONCAT22(uVar192,uVar186);
        auVar28._6_8_ = SUB148(auVar49 << 0x40,6);
        auVar7._10_2_ = 0;
        auVar7._0_10_ = auVar174._0_10_;
        auVar7._12_2_ = uVar182;
        auVar15._8_2_ = uVar180;
        auVar15._0_8_ = uVar171;
        auVar15._10_4_ = auVar7._10_4_;
        auVar50._6_8_ = 0;
        auVar50._0_6_ = auVar15._8_6_;
        auVar24._4_2_ = uVar178;
        auVar24._0_4_ = CONCAT22(uVar178,uVar170);
        auVar24._6_8_ = SUB148(auVar50 << 0x40,6);
        auVar107._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar186 << 5));
        auVar107._4_4_ = -(uint)(aiStack_84[0] < auVar28._4_4_ << 5);
        auVar107._8_4_ = -(uint)(aiStack_84[0] < auVar21._8_4_ << 5);
        auVar107._12_4_ = -(uint)(aiStack_84[0] < (int)((auVar14._10_4_ >> 0x10) << 5));
        auVar202._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar198 << 5));
        auVar202._4_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar189._10_2_ << 5));
        auVar202._8_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar189._12_2_ << 5));
        auVar202._12_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar189._14_2_ << 5));
        auVar65 = packssdw(auVar107,auVar202);
        auVar117._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar170 << 5));
        auVar117._4_4_ = -(uint)(aiStack_84[0] < auVar24._4_4_ << 5);
        auVar117._8_4_ = -(uint)(aiStack_84[0] < auVar15._8_4_ << 5);
        auVar117._12_4_ = -(uint)(aiStack_84[0] < (int)((auVar7._10_4_ >> 0x10) << 5));
        auVar212._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar184 << 5));
        auVar212._4_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar174._10_2_ << 5));
        auVar212._8_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar174._12_2_ << 5));
        auVar212._12_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar174._14_2_ << 5));
        auVar101 = packssdw(auVar117,auVar212);
        auVar104 = auVar101 | auVar65;
        if ((((((((((((((((auVar104 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar104 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar104 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar104 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar104 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar104 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar104 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar104 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar104 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar104 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar104 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar104 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar104 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar104 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar104 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar104[0xf] < '\0') {
          auVar65 = auVar65 & *(undefined1 (*) [16])(iscan + lVar61);
          auVar101 = auVar101 & *(undefined1 (*) [16])(iscan + lVar61 + 8);
          sVar138 = auVar65._0_2_;
          sVar115 = auVar101._0_2_;
          uVar183 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
          sVar138 = auVar65._2_2_;
          sVar115 = auVar101._2_2_;
          uVar185 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
          sVar138 = auVar65._4_2_;
          sVar115 = auVar101._4_2_;
          uVar191 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
          sVar138 = auVar65._6_2_;
          sVar115 = auVar101._6_2_;
          uVar193 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
          sVar138 = auVar65._8_2_;
          sVar115 = auVar101._8_2_;
          uVar195 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
          sVar138 = auVar65._10_2_;
          sVar115 = auVar101._10_2_;
          uVar197 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
          sVar138 = auVar65._12_2_;
          sVar115 = auVar101._12_2_;
          sVar119 = auVar101._14_2_;
          uVar118 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
          sVar138 = auVar65._14_2_;
          uVar120 = (ushort)(sVar119 < sVar138) * sVar138 | (ushort)(sVar119 >= sVar138) * sVar119;
          bVar56 = true;
        }
        uVar129 = ((short)uVar129 < (short)uVar183) * uVar183 |
                  ((short)uVar129 >= (short)uVar183) * uVar129;
        uVar135 = ((short)uVar135 < (short)uVar185) * uVar185 |
                  ((short)uVar135 >= (short)uVar185) * uVar135;
        uVar136 = ((short)uVar136 < (short)uVar191) * uVar191 |
                  ((short)uVar136 >= (short)uVar191) * uVar136;
        uVar137 = ((short)uVar137 < (short)uVar193) * uVar193 |
                  ((short)uVar137 >= (short)uVar193) * uVar137;
        uVar139 = ((short)uVar139 < (short)uVar195) * uVar195 |
                  ((short)uVar139 >= (short)uVar195) * uVar139;
        uVar140 = ((short)uVar140 < (short)uVar197) * uVar197 |
                  ((short)uVar140 >= (short)uVar197) * uVar140;
        uVar141 = ((short)uVar141 < (short)uVar118) * uVar118 |
                  ((short)uVar141 >= (short)uVar118) * uVar141;
        uVar142 = ((short)uVar142 < (short)uVar120) * uVar120 |
                  ((short)uVar142 >= (short)uVar120) * uVar142;
        auVar203._0_2_ = -(ushort)(sVar66 < (short)uVar186);
        auVar203._2_2_ = -(ushort)(sVar67 < (short)uVar192);
        auVar203._4_2_ = -(ushort)(sVar68 < (short)uVar194);
        auVar203._6_2_ = -(ushort)(sVar69 < (short)uVar196);
        auVar203._8_2_ = -(ushort)(sVar66 < (short)uVar198);
        auVar203._10_2_ = -(ushort)(sVar67 < (short)auVar189._10_2_);
        auVar203._12_2_ = -(ushort)(sVar68 < (short)auVar189._12_2_);
        auVar203._14_2_ = -(ushort)(sVar69 < (short)auVar189._14_2_);
        auVar213._0_2_ = -(ushort)(sVar66 < (short)uVar170);
        auVar213._2_2_ = -(ushort)(sVar67 < (short)uVar178);
        auVar213._4_2_ = -(ushort)(sVar68 < (short)uVar180);
        auVar213._6_2_ = -(ushort)(sVar69 < (short)uVar182);
        auVar213._8_2_ = -(ushort)(sVar66 < (short)uVar184);
        auVar213._10_2_ = -(ushort)(sVar67 < (short)auVar174._10_2_);
        auVar213._12_2_ = -(ushort)(sVar68 < (short)auVar174._12_2_);
        auVar213._14_2_ = -(ushort)(sVar69 < (short)auVar174._14_2_);
        auVar65 = auVar213 | auVar203;
        if ((((((((((((((((auVar65 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar65 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar65 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar65 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar65 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar65 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar65 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar65 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar65 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar65 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar65 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar65 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar65[0xf] < '\0') break;
        uVar126 = (-1 < (short)uVar126) * uVar126;
        uVar125 = (-1 < (short)uVar125) * uVar125;
        uVar181 = (-1 < (short)uVar181) * uVar181;
        uVar179 = (-1 < (short)uVar179) * uVar179;
        uVar177 = (-1 < (short)uVar177) * uVar177;
        uVar169 = (-1 < (short)uVar169) * uVar169;
        uVar128 = (-1 < (short)uVar128) * uVar128;
        uVar127 = (-1 < (short)uVar127) * uVar127;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61) = (undefined1  [16])0x0;
        lVar62 = lVar62 + 0x10;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61) = (undefined1  [16])0x0;
        lVar61 = lVar62;
        if (n_coeffs <= lVar62) goto LAB_00311a57;
      }
      auVar131 = psraw(auVar131,0xf);
      auVar116 = psraw(auVar116,0xf);
      auVar65 = *(undefined1 (*) [16])(iscan + lVar61) & auVar203;
      auVar101 = *(undefined1 (*) [16])(iscan + lVar61 + 8) & auVar213;
      sVar138 = auVar65._0_2_;
      sVar115 = auVar101._0_2_;
      uVar183 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
      sVar138 = auVar65._2_2_;
      sVar115 = auVar101._2_2_;
      uVar185 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
      sVar138 = auVar65._4_2_;
      sVar115 = auVar101._4_2_;
      uVar191 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
      sVar138 = auVar65._6_2_;
      sVar115 = auVar101._6_2_;
      uVar193 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
      sVar138 = auVar65._8_2_;
      sVar115 = auVar101._8_2_;
      uVar195 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
      sVar138 = auVar65._10_2_;
      sVar115 = auVar101._10_2_;
      uVar197 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
      sVar138 = auVar65._12_2_;
      sVar115 = auVar101._12_2_;
      sVar119 = auVar101._14_2_;
      uVar118 = (ushort)(sVar115 < sVar138) * sVar138 | (ushort)(sVar115 >= sVar138) * sVar115;
      sVar138 = auVar65._14_2_;
      uVar120 = (ushort)(sVar119 < sVar138) * sVar138 | (ushort)(sVar119 >= sVar138) * sVar119;
      uVar126 = ((short)uVar183 < (short)uVar126) * uVar126 |
                ((short)uVar183 >= (short)uVar126) * uVar183;
      uVar125 = ((short)uVar185 < (short)uVar125) * uVar125 |
                ((short)uVar185 >= (short)uVar125) * uVar185;
      uVar181 = ((short)uVar191 < (short)uVar181) * uVar181 |
                ((short)uVar191 >= (short)uVar181) * uVar191;
      uVar179 = ((short)uVar193 < (short)uVar179) * uVar179 |
                ((short)uVar193 >= (short)uVar179) * uVar193;
      uVar177 = ((short)uVar195 < (short)uVar177) * uVar177 |
                ((short)uVar195 >= (short)uVar177) * uVar195;
      uVar169 = ((short)uVar197 < (short)uVar169) * uVar169 |
                ((short)uVar197 >= (short)uVar169) * uVar197;
      uVar128 = ((short)uVar118 < (short)uVar128) * uVar128 |
                ((short)uVar118 >= (short)uVar128) * uVar118;
      uVar127 = ((short)uVar120 < (short)uVar127) * uVar127 |
                ((short)uVar120 >= (short)uVar127) * uVar120;
      auVar101 = paddsw(auVar189,auVar150);
      auVar65 = pmulhw(auVar101,local_68);
      auVar85._0_2_ = auVar65._0_2_ + auVar101._0_2_;
      auVar85._2_2_ = auVar65._2_2_ + auVar101._2_2_;
      auVar85._4_2_ = auVar65._4_2_ + auVar101._4_2_;
      auVar85._6_2_ = auVar65._6_2_ + auVar101._6_2_;
      auVar85._8_2_ = auVar65._8_2_ + auVar101._8_2_;
      auVar85._10_2_ = auVar65._10_2_ + auVar101._10_2_;
      auVar85._12_2_ = auVar65._12_2_ + auVar101._12_2_;
      auVar85._14_2_ = auVar65._14_2_ + auVar101._14_2_;
      auVar65 = pmulhw(auVar85,auVar103);
      auVar108._0_2_ = (ushort)(auVar85._0_2_ * auVar103._0_2_) >> 0xe;
      auVar108._2_2_ = (ushort)(auVar85._2_2_ * auVar103._2_2_) >> 0xe;
      auVar108._4_2_ = (ushort)(auVar85._4_2_ * auVar103._4_2_) >> 0xe;
      auVar108._6_2_ = (ushort)(auVar85._6_2_ * auVar103._6_2_) >> 0xe;
      auVar108._8_2_ = (ushort)(auVar85._8_2_ * auVar103._8_2_) >> 0xe;
      auVar108._10_2_ = (ushort)(auVar85._10_2_ * auVar103._10_2_) >> 0xe;
      auVar108._12_2_ = (ushort)(auVar85._12_2_ * auVar103._12_2_) >> 0xe;
      auVar108._14_2_ = (ushort)(auVar85._14_2_ * auVar103._14_2_) >> 0xe;
      auVar65 = psllw(auVar65,2);
      auVar104 = paddsw(auVar174,auVar150);
      auVar101 = pmulhw(auVar104,local_68);
      auVar144._0_2_ = auVar101._0_2_ + auVar104._0_2_;
      auVar144._2_2_ = auVar101._2_2_ + auVar104._2_2_;
      auVar144._4_2_ = auVar101._4_2_ + auVar104._4_2_;
      auVar144._6_2_ = auVar101._6_2_ + auVar104._6_2_;
      auVar144._8_2_ = auVar101._8_2_ + auVar104._8_2_;
      auVar144._10_2_ = auVar101._10_2_ + auVar104._10_2_;
      auVar144._12_2_ = auVar101._12_2_ + auVar104._12_2_;
      auVar144._14_2_ = auVar101._14_2_ + auVar104._14_2_;
      auVar101 = pmulhw(auVar144,auVar103);
      auVar109._0_2_ = (ushort)(auVar144._0_2_ * auVar103._0_2_) >> 0xe;
      auVar109._2_2_ = (ushort)(auVar144._2_2_ * auVar103._2_2_) >> 0xe;
      auVar109._4_2_ = (ushort)(auVar144._4_2_ * auVar103._4_2_) >> 0xe;
      auVar109._6_2_ = (ushort)(auVar144._6_2_ * auVar103._6_2_) >> 0xe;
      auVar109._8_2_ = (ushort)(auVar144._8_2_ * auVar103._8_2_) >> 0xe;
      auVar109._10_2_ = (ushort)(auVar144._10_2_ * auVar103._10_2_) >> 0xe;
      auVar109._12_2_ = (ushort)(auVar144._12_2_ * auVar103._12_2_) >> 0xe;
      auVar109._14_2_ = (ushort)(auVar144._14_2_ * auVar103._14_2_) >> 0xe;
      auVar101 = psllw(auVar101,2);
      auVar65 = (auVar65 | auVar108) ^ auVar131;
      auVar86._0_2_ = auVar65._0_2_ - auVar131._0_2_;
      auVar86._2_2_ = auVar65._2_2_ - auVar131._2_2_;
      auVar86._4_2_ = auVar65._4_2_ - auVar131._4_2_;
      auVar86._6_2_ = auVar65._6_2_ - auVar131._6_2_;
      auVar86._8_2_ = auVar65._8_2_ - auVar131._8_2_;
      auVar86._10_2_ = auVar65._10_2_ - auVar131._10_2_;
      auVar86._12_2_ = auVar65._12_2_ - auVar131._12_2_;
      auVar86._14_2_ = auVar65._14_2_ - auVar131._14_2_;
      auVar65 = (auVar101 | auVar109) ^ auVar116;
      auVar145._0_2_ = auVar65._0_2_ - auVar116._0_2_;
      auVar145._2_2_ = auVar65._2_2_ - auVar116._2_2_;
      auVar145._4_2_ = auVar65._4_2_ - auVar116._4_2_;
      auVar145._6_2_ = auVar65._6_2_ - auVar116._6_2_;
      auVar145._8_2_ = auVar65._8_2_ - auVar116._8_2_;
      auVar145._10_2_ = auVar65._10_2_ - auVar116._10_2_;
      auVar145._12_2_ = auVar65._12_2_ - auVar116._12_2_;
      auVar145._14_2_ = auVar65._14_2_ - auVar116._14_2_;
      auVar86 = auVar86 & auVar203;
      auVar145 = auVar145 & auVar213;
      sVar70 = auVar86._0_2_;
      sVar138 = -sVar70;
      sVar89 = auVar86._2_2_;
      sVar115 = -sVar89;
      sVar90 = auVar86._4_2_;
      sVar119 = -sVar90;
      sVar92 = auVar86._6_2_;
      sVar143 = -sVar92;
      sVar93 = auVar86._8_2_;
      sVar147 = -sVar93;
      sVar96 = auVar86._10_2_;
      sVar2 = -sVar96;
      sVar97 = auVar86._12_2_;
      sVar3 = -sVar97;
      sVar100 = auVar86._14_2_;
      sVar4 = -sVar100;
      auVar154._0_2_ = (ushort)(sVar138 < sVar70) * sVar70 | (ushort)(sVar138 >= sVar70) * sVar138;
      auVar154._2_2_ = (ushort)(sVar115 < sVar89) * sVar89 | (ushort)(sVar115 >= sVar89) * sVar115;
      auVar154._4_2_ = (ushort)(sVar119 < sVar90) * sVar90 | (ushort)(sVar119 >= sVar90) * sVar119;
      auVar154._6_2_ = (ushort)(sVar143 < sVar92) * sVar92 | (ushort)(sVar143 >= sVar92) * sVar143;
      auVar154._8_2_ = (ushort)(sVar147 < sVar93) * sVar93 | (ushort)(sVar147 >= sVar93) * sVar147;
      auVar154._10_2_ = (ushort)(sVar2 < sVar96) * sVar96 | (ushort)(sVar2 >= sVar96) * sVar2;
      auVar154._12_2_ = (ushort)(sVar3 < sVar97) * sVar97 | (ushort)(sVar3 >= sVar97) * sVar3;
      auVar154._14_2_ = (ushort)(sVar4 < sVar100) * sVar100 | (ushort)(sVar4 >= sVar100) * sVar4;
      auVar65 = psraw(auVar86,0xf);
      auVar113._0_12_ = auVar86._0_12_;
      auVar113._12_2_ = sVar92;
      auVar113._14_2_ = auVar65._6_2_;
      auVar112._12_4_ = auVar113._12_4_;
      auVar112._0_10_ = auVar86._0_10_;
      auVar112._10_2_ = auVar65._4_2_;
      auVar111._10_6_ = auVar112._10_6_;
      auVar111._0_8_ = auVar86._0_8_;
      auVar111._8_2_ = sVar90;
      auVar110._8_8_ = auVar111._8_8_;
      auVar110._6_2_ = auVar65._2_2_;
      auVar110._4_2_ = sVar89;
      auVar110._2_2_ = auVar65._0_2_;
      auVar110._0_2_ = sVar70;
      uVar183 = auVar65._10_2_;
      uVar185 = auVar65._12_2_;
      uVar191 = auVar65._14_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar61) = auVar110;
      ptVar1 = qcoeff_ptr + lVar61 + 4;
      *(short *)ptVar1 = sVar93;
      *(ushort *)((long)ptVar1 + 2) = auVar65._8_2_;
      *(short *)(ptVar1 + 1) = sVar96;
      *(ushort *)((long)ptVar1 + 6) = uVar183;
      *(short *)(ptVar1 + 2) = sVar97;
      *(ushort *)((long)ptVar1 + 10) = uVar185;
      *(short *)(ptVar1 + 3) = sVar100;
      *(ushort *)((long)ptVar1 + 0xe) = uVar191;
      sVar70 = auVar145._0_2_;
      sVar138 = -sVar70;
      sVar89 = auVar145._2_2_;
      sVar115 = -sVar89;
      sVar90 = auVar145._4_2_;
      sVar119 = -sVar90;
      sVar92 = auVar145._6_2_;
      sVar143 = -sVar92;
      sVar93 = auVar145._8_2_;
      sVar147 = -sVar93;
      sVar96 = auVar145._10_2_;
      sVar2 = -sVar96;
      sVar97 = auVar145._12_2_;
      sVar3 = -sVar97;
      sVar100 = auVar145._14_2_;
      sVar4 = -sVar100;
      auVar114._0_2_ = (ushort)(sVar138 < sVar70) * sVar70 | (ushort)(sVar138 >= sVar70) * sVar138;
      auVar114._2_2_ = (ushort)(sVar115 < sVar89) * sVar89 | (ushort)(sVar115 >= sVar89) * sVar115;
      auVar114._4_2_ = (ushort)(sVar119 < sVar90) * sVar90 | (ushort)(sVar119 >= sVar90) * sVar119;
      auVar114._6_2_ = (ushort)(sVar143 < sVar92) * sVar92 | (ushort)(sVar143 >= sVar92) * sVar143;
      auVar114._8_2_ = (ushort)(sVar147 < sVar93) * sVar93 | (ushort)(sVar147 >= sVar93) * sVar147;
      auVar114._10_2_ = (ushort)(sVar2 < sVar96) * sVar96 | (ushort)(sVar2 >= sVar96) * sVar2;
      auVar114._12_2_ = (ushort)(sVar3 < sVar97) * sVar97 | (ushort)(sVar3 >= sVar97) * sVar3;
      auVar114._14_2_ = (ushort)(sVar4 < sVar100) * sVar100 | (ushort)(sVar4 >= sVar100) * sVar4;
      auVar101 = psraw(auVar145,0xf);
      auVar166._0_12_ = auVar145._0_12_;
      auVar166._12_2_ = sVar92;
      auVar166._14_2_ = auVar101._6_2_;
      auVar165._12_4_ = auVar166._12_4_;
      auVar165._0_10_ = auVar145._0_10_;
      auVar165._10_2_ = auVar101._4_2_;
      auVar164._10_6_ = auVar165._10_6_;
      auVar164._0_8_ = auVar145._0_8_;
      auVar164._8_2_ = sVar90;
      auVar163._8_8_ = auVar164._8_8_;
      auVar163._6_2_ = auVar101._2_2_;
      auVar163._4_2_ = sVar89;
      auVar163._2_2_ = auVar101._0_2_;
      auVar163._0_2_ = sVar70;
      uVar193 = auVar101._10_2_;
      uVar195 = auVar101._12_2_;
      uVar197 = auVar101._14_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 8) = auVar163;
      ptVar1 = qcoeff_ptr + lVar61 + 0xc;
      *(short *)ptVar1 = sVar93;
      *(ushort *)((long)ptVar1 + 2) = auVar101._8_2_;
      *(short *)(ptVar1 + 1) = sVar96;
      *(ushort *)((long)ptVar1 + 6) = uVar193;
      *(short *)(ptVar1 + 2) = sVar97;
      *(ushort *)((long)ptVar1 + 10) = uVar195;
      *(short *)(ptVar1 + 3) = sVar100;
      *(ushort *)((long)ptVar1 + 0xe) = uVar197;
      auVar8._10_2_ = 0;
      auVar8._0_10_ = auVar65._0_10_;
      auVar8._12_2_ = auVar65._6_2_;
      auVar16._8_2_ = auVar65._4_2_;
      auVar16._0_8_ = auVar65._0_8_;
      auVar16._10_4_ = auVar8._10_4_;
      auVar51._6_8_ = 0;
      auVar51._0_6_ = auVar16._8_6_;
      auVar25._4_2_ = auVar65._2_2_;
      auVar25._0_4_ = auVar65._0_4_;
      auVar25._6_8_ = SUB148(auVar51 << 0x40,6);
      auVar167._0_4_ = auVar65._0_4_ & 0xffff;
      auVar167._4_10_ = auVar25._4_10_;
      auVar167._14_2_ = 0;
      auVar87._0_4_ = CONCAT22(0,auVar65._8_2_);
      auVar87._4_2_ = uVar183;
      auVar87._6_2_ = 0;
      auVar87._8_2_ = uVar185;
      auVar87._10_2_ = 0;
      auVar87._12_2_ = uVar191;
      auVar87._14_2_ = 0;
      sVar138 = auVar154._6_2_ * auVar124._6_2_;
      auVar65 = pmulhw(auVar154,auVar124);
      uVar59 = CONCAT22(auVar65._6_2_,sVar138);
      Var45 = CONCAT64(CONCAT42(uVar59,auVar65._4_2_),
                       CONCAT22(auVar154._4_2_ * auVar124._4_2_,sVar138));
      auVar52._4_8_ = (long)((unkuint10)Var45 >> 0x10);
      auVar52._2_2_ = auVar65._2_2_;
      auVar52._0_2_ = auVar154._2_2_ * auVar124._2_2_;
      uVar71 = CONCAT22(auVar65._8_2_,auVar154._8_2_ * auVar124._8_2_);
      auVar172._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(auVar154._10_2_ * auVar124._10_2_,uVar71));
      auVar172._8_2_ = auVar154._12_2_ * auVar124._12_2_;
      auVar172._10_2_ = auVar65._12_2_;
      auVar175._12_2_ = auVar154._14_2_ * auVar124._14_2_;
      auVar175._0_12_ = auVar172;
      auVar175._14_2_ = auVar65._14_2_;
      auVar190._0_4_ = CONCAT22(auVar65._0_2_,auVar154._0_2_ * auVar124._0_2_) >> 2;
      auVar190._4_4_ = auVar52._0_4_ >> 2;
      auVar190._8_4_ = (uint)((unkuint10)Var45 >> 0x10) >> 2;
      auVar190._12_4_ = uVar59 >> 2;
      auVar176._0_4_ = uVar71 >> 2;
      auVar176._4_4_ = (uint)((ulong)auVar172._0_8_ >> 0x22);
      auVar176._8_4_ = auVar172._8_4_ >> 2;
      auVar176._12_4_ = auVar175._12_4_ >> 2;
      auVar190 = auVar190 ^ auVar167;
      auVar176 = auVar176 ^ auVar87;
      piVar63 = dqcoeff_ptr + lVar61;
      *piVar63 = auVar190._0_4_ - auVar167._0_4_;
      piVar63[1] = auVar190._4_4_ - auVar25._4_4_;
      piVar63[2] = auVar190._8_4_ - auVar16._8_4_;
      piVar63[3] = auVar190._12_4_ - (auVar8._10_4_ >> 0x10);
      piVar63 = dqcoeff_ptr + lVar61 + 4;
      *piVar63 = auVar176._0_4_ - auVar87._0_4_;
      piVar63[1] = auVar176._4_4_ - (uint)uVar183;
      piVar63[2] = auVar176._8_4_ - (uint)uVar185;
      piVar63[3] = auVar176._12_4_ - (uint)uVar191;
      auVar9._10_2_ = 0;
      auVar9._0_10_ = auVar101._0_10_;
      auVar9._12_2_ = auVar101._6_2_;
      auVar17._8_2_ = auVar101._4_2_;
      auVar17._0_8_ = auVar101._0_8_;
      auVar17._10_4_ = auVar9._10_4_;
      auVar53._6_8_ = 0;
      auVar53._0_6_ = auVar17._8_6_;
      auVar26._4_2_ = auVar101._2_2_;
      auVar26._0_4_ = auVar101._0_4_;
      auVar26._6_8_ = SUB148(auVar53 << 0x40,6);
      auVar88._0_4_ = auVar101._0_4_ & 0xffff;
      auVar88._4_10_ = auVar26._4_10_;
      auVar88._14_2_ = 0;
      auVar146._0_4_ = CONCAT22(0,auVar101._8_2_);
      auVar146._4_2_ = uVar193;
      auVar146._6_2_ = 0;
      auVar146._8_2_ = uVar195;
      auVar146._10_2_ = 0;
      auVar146._12_2_ = uVar197;
      auVar146._14_2_ = 0;
      sVar138 = auVar114._6_2_ * auVar124._6_2_;
      auVar65 = pmulhw(auVar114,auVar124);
      uVar59 = CONCAT22(auVar65._6_2_,sVar138);
      Var45 = CONCAT64(CONCAT42(uVar59,auVar65._4_2_),
                       CONCAT22(auVar114._4_2_ * auVar124._4_2_,sVar138));
      auVar54._4_8_ = (long)((unkuint10)Var45 >> 0x10);
      auVar54._2_2_ = auVar65._2_2_;
      auVar54._0_2_ = auVar114._2_2_ * auVar124._2_2_;
      uVar71 = CONCAT22(auVar65._8_2_,auVar114._8_2_ * auVar124._8_2_);
      auVar149._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(auVar114._10_2_ * auVar124._10_2_,uVar71));
      auVar149._8_2_ = auVar114._12_2_ * auVar124._12_2_;
      auVar149._10_2_ = auVar65._12_2_;
      auVar155._12_2_ = auVar114._14_2_ * auVar124._14_2_;
      auVar155._0_12_ = auVar149;
      auVar155._14_2_ = auVar65._14_2_;
      auVar168._0_4_ = CONCAT22(auVar65._0_2_,auVar114._0_2_ * auVar124._0_2_) >> 2;
      auVar168._4_4_ = auVar54._0_4_ >> 2;
      auVar168._8_4_ = (uint)((unkuint10)Var45 >> 0x10) >> 2;
      auVar168._12_4_ = uVar59 >> 2;
      auVar156._0_4_ = uVar71 >> 2;
      auVar156._4_4_ = (uint)((ulong)auVar149._0_8_ >> 0x22);
      auVar156._8_4_ = auVar149._8_4_ >> 2;
      auVar156._12_4_ = auVar155._12_4_ >> 2;
      auVar168 = auVar168 ^ auVar88;
      auVar156 = auVar156 ^ auVar146;
      piVar63 = dqcoeff_ptr + lVar61 + 8;
      *piVar63 = auVar168._0_4_ - auVar88._0_4_;
      piVar63[1] = auVar168._4_4_ - auVar26._4_4_;
      piVar63[2] = auVar168._8_4_ - auVar17._8_4_;
      piVar63[3] = auVar168._12_4_ - (auVar9._10_4_ >> 0x10);
      piVar63 = dqcoeff_ptr + lVar61 + 0xc;
      *piVar63 = auVar156._0_4_ - auVar146._0_4_;
      piVar63[1] = auVar156._4_4_ - (uint)uVar193;
      piVar63[2] = auVar156._8_4_ - (uint)uVar195;
      piVar63[3] = auVar156._12_4_ - (uint)uVar197;
      lVar61 = (long)iVar72;
      bVar57 = true;
      bVar18 = true;
    } while (lVar61 < n_coeffs);
  }
LAB_00311a57:
  if (bVar56) {
    uVar139 = ((short)uVar139 < (short)uVar129) * uVar129 |
              ((short)uVar139 >= (short)uVar129) * uVar139;
    uVar140 = ((short)uVar140 < (short)uVar135) * uVar135 |
              ((short)uVar140 >= (short)uVar135) * uVar140;
    uVar141 = ((short)uVar141 < (short)uVar136) * uVar136 |
              ((short)uVar141 >= (short)uVar136) * uVar141;
    uVar137 = ((short)uVar142 < (short)uVar137) * uVar137 |
              ((short)uVar142 >= (short)uVar137) * uVar142;
    uVar142 = ((short)uVar141 < (short)uVar139) * uVar139 |
              ((short)uVar141 >= (short)uVar139) * uVar141;
    uVar141 = ((short)uVar137 < (short)uVar140) * uVar140 |
              ((short)uVar137 >= (short)uVar140) * uVar137;
    uVar59 = (ushort)(((short)uVar141 < (short)uVar142) * uVar142 |
                     ((short)uVar141 >= (short)uVar142) * uVar141) + 1;
  }
  else {
    uVar59 = 0;
  }
  if (bVar57) {
    uVar142 = ((short)uVar177 < (short)uVar126) * uVar126 |
              ((short)uVar177 >= (short)uVar126) * uVar177;
    uVar141 = ((short)uVar169 < (short)uVar125) * uVar125 |
              ((short)uVar169 >= (short)uVar125) * uVar169;
    uVar140 = ((short)uVar128 < (short)uVar181) * uVar181 |
              ((short)uVar128 >= (short)uVar181) * uVar128;
    uVar139 = ((short)uVar127 < (short)uVar179) * uVar179 |
              ((short)uVar127 >= (short)uVar179) * uVar127;
    uVar142 = ((short)uVar140 < (short)uVar142) * uVar142 |
              ((short)uVar140 >= (short)uVar142) * uVar140;
    uVar141 = ((short)uVar139 < (short)uVar141) * uVar141 |
              ((short)uVar139 >= (short)uVar141) * uVar139;
    uVar71 = (uint)(ushort)(((short)uVar141 < (short)uVar142) * uVar142 |
                           ((short)uVar141 >= (short)uVar142) * uVar141);
  }
  else {
    uVar71 = 0xffffffff;
  }
  if ((int)uVar59 <= (int)uVar71) {
    iVar72 = uVar71 + 1;
    psVar60 = scan + uVar71;
    do {
      sVar138 = *psVar60;
      qcoeff_ptr[sVar138] = 0;
      dqcoeff_ptr[sVar138] = 0;
      iVar72 = iVar72 + -1;
      psVar60 = psVar60 + -1;
    } while ((int)uVar59 < iVar72);
  }
  iVar72 = uVar59 + 1;
  uVar58 = (ulong)uVar59;
  do {
    if ((long)uVar58 < 1) {
      uVar142 = 0;
      break;
    }
    lVar61 = uVar58 - 1;
    uVar58 = uVar58 - 1;
    iVar72 = iVar72 + -1;
    uVar142 = (ushort)iVar72;
  } while (qcoeff_ptr[scan[lVar61]] == 0);
  *eob_ptr = uVar142;
  uVar71 = 0xffffffff;
  if (uVar59 != 0) {
    uVar58 = 0;
    do {
      if (qcoeff_ptr[scan[uVar58]] != 0) {
        uVar71 = (uint)uVar58;
        break;
      }
      uVar58 = uVar58 + 1;
    } while (uVar59 != uVar58);
  }
  if ((uVar142 != 0) && (uVar71 == uVar142 - 1)) {
    sVar138 = scan[uVar71];
    if (((qcoeff_ptr[sVar138] == 1) || (qcoeff_ptr[sVar138] == -1)) &&
       (uVar59 = coeff_ptr[sVar138] >> 0x1f,
       (int)((coeff_ptr[sVar138] << 5 ^ uVar59) - uVar59) <
       *(int *)(local_68 + (ulong)(sVar138 != 0) * 4 + -8) * 0x20 +
       (dequant_ptr[sVar138 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar138] = 0;
      dqcoeff_ptr[sVar138] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_64x64_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  const int log_scale = 2;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i log_scale_vec = _mm_set1_epi16(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, log_scale_vec);
  round = _mm_add_epi16(round, log_scale_vec);
  zbin = _mm_srli_epi16(zbin, log_scale);
  round = _mm_srli_epi16(round, log_scale);
  zbin = _mm_sub_epi16(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);
    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}